

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O2

void __thiscall
iu_DISABLED_TestFailure_x_iutest_x_Subroutine2_Test::Body
          (iu_DISABLED_TestFailure_x_iutest_x_Subroutine2_Test *this)

{
  iuCodeMessage *msg;
  ScopedMessage scoped_message_4;
  iuCodeMessage local_1f0;
  ScopedMessage scoped_message_3;
  iuStreamMessage local_190;
  
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::detail::iuStreamMessage::operator<<(&local_190,(char (*) [10])"routine2.");
  std::__cxx11::stringbuf::str();
  scoped_message_4.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp";
  scoped_message_4.super_iuCodeMessage.m_line = 0x87;
  iutest::AssertionHelper::ScopedMessage::ScopedMessage
            (&scoped_message_3,&scoped_message_4.super_iuCodeMessage);
  std::__cxx11::string::~string((string *)&scoped_message_4);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::detail::iuStreamMessage::operator<<(&local_190,(char (*) [10])"routine2.");
  std::__cxx11::stringbuf::str();
  local_1f0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp";
  local_1f0.m_line = 0x89;
  msg = iutest::detail::iuCodeMessage::operator<<(&local_1f0,(char (*) [15])"iutest can do.");
  iutest::AssertionHelper::ScopedMessage::ScopedMessage(&scoped_message_4,msg);
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  Sub2(2);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage(&scoped_message_4);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage(&scoped_message_3);
  Sub2(3);
  return;
}

Assistant:

IUTEST(DISABLED_TestFailure, Subroutine2)
{
    {
        IUTEST_SCOPED_TRACE("routine2.");
#if !defined(IUTEST_USE_GTEST)
        IUTEST_SCOPED_TRACE("routine2.") << "iutest can do.";
#endif

        Sub2(2);
    }
    // ここの失敗には "routine2." のメッセージは表示されません。
    Sub2(3);
}